

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diyfp.h
# Opt level: O0

DiyFp rapidjson::internal::GetCachedPower10(int exp,int *outExp)

{
  uint uVar1;
  RapidJSONException *this;
  DiyFp DVar2;
  DiyFp DVar3;
  uint index;
  int *outExp_local;
  int exp_local;
  
  if (exp < -0x15c) {
    this = (RapidJSONException *)__cxa_allocate_exception(0x10);
    cereal::RapidJSONException::RapidJSONException
              (this,"rapidjson internal assertion failure: exp >= -348");
    __cxa_throw(this,&cereal::RapidJSONException::typeinfo,
                cereal::RapidJSONException::~RapidJSONException);
  }
  uVar1 = exp + 0x15cU >> 3;
  *outExp = uVar1 * 8 + -0x15c;
  DVar2 = GetCachedPowerByIndex((ulong)uVar1);
  DVar3._12_4_ = 0;
  DVar3.f = SUB128(DVar2._0_12_,0);
  DVar3.e = SUB124(DVar2._0_12_,8);
  return DVar3;
}

Assistant:

inline DiyFp GetCachedPower10(int exp, int *outExp) {
    CEREAL_RAPIDJSON_ASSERT(exp >= -348);
    unsigned index = static_cast<unsigned>(exp + 348) / 8u;
    *outExp = -348 + static_cast<int>(index) * 8;
    return GetCachedPowerByIndex(index);
}